

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

CKeyID * __thiscall CPubKey::GetID(CKeyID *__return_storage_ptr__,CPubKey *this)

{
  byte bVar1;
  long in_FS_OFFSET;
  Span<const_unsigned_char> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->vch[0] & 0xfe) == 2) {
    local_20.m_size = 0x21;
  }
  else {
    bVar1 = this->vch[0] - 4;
    if (bVar1 < 4) {
      local_20.m_size = *(size_t *)(&DAT_003f6198 + (ulong)bVar1 * 8);
    }
    else {
      local_20.m_size = 0;
    }
  }
  local_20.m_data = this->vch;
  Hash160<Span<unsigned_char_const>>(&__return_storage_ptr__->super_uint160,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CKeyID GetID() const
    {
        return CKeyID(Hash160(Span{vch}.first(size())));
    }